

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge-swap-reduce.cpp
# Opt level: O0

void median_reduce(Block *b,ReduceProxy *rp,RegularMergePartners *param_3)

{
  int iVar1;
  int iVar2;
  int iVar3;
  BlockID BVar4;
  reference pvVar5;
  Link *f;
  Link *args;
  ReduceProxy *in_RSI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Point PVar6;
  int i_1;
  Point median;
  Point med;
  int nbr_gid;
  int i;
  vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> medians;
  uint round;
  Link *in_stack_fffffffffffffe68;
  vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  BlockID in_stack_fffffffffffffe80;
  vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *in_stack_fffffffffffffe90;
  uint *in_stack_fffffffffffffec0;
  int *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  FILE *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  float fVar7;
  undefined1 in_stack_fffffffffffffee8 [16];
  undefined1 auVar8 [16];
  int local_94;
  int local_8c;
  int local_54;
  int local_48;
  
  diy::ReduceProxy::round(in_RSI,(double)CONCAT44(in_XMM0_Db,in_XMM0_Da));
  Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::vector
            ((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)0x14c588);
  Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::back
            (in_stack_fffffffffffffe70);
  Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
  push_back((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
            in_stack_fffffffffffffe80,
            (value_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  local_48 = 0;
  while( true ) {
    diy::ReduceProxy::in_link(in_RSI);
    iVar1 = diy::Link::size((Link *)0x14c5eb);
    if (iVar1 <= local_48) break;
    diy::ReduceProxy::in_link(in_RSI);
    BVar4 = diy::Link::target(in_stack_fffffffffffffe68,0);
    local_54 = BVar4.gid;
    iVar1 = diy::Master::Proxy::gid(&in_RSI->super_Proxy);
    if (local_54 == iVar1) {
      diy::Master::Proxy::gid(&in_RSI->super_Proxy);
      fmt::v7::print<char[38],int,unsigned_int&,char>
                (in_stack_fffffffffffffed8,
                 (char (*) [38])CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    }
    else {
      diy::Point<float,_3U>::Point((Point<float,_3U> *)in_stack_fffffffffffffe70);
      diy::Master::Proxy::dequeue<diy::Point<float,3u>>
                ((Proxy *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                 (Point<float,_3U> *)in_stack_fffffffffffffe70,
                 (_func_void_BinaryBuffer_ptr_Point<float,_3U>_ptr *)in_stack_fffffffffffffe68);
      diy::Master::Proxy::gid(&in_RSI->super_Proxy);
      fmt::v7::print<char[42],int,unsigned_int&,int&,char>
                (in_stack_fffffffffffffee8._0_8_,
                 (char (*) [42])CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (int *)in_stack_fffffffffffffed8,
                 (uint *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8);
      Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::
      push_back((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
                in_stack_fffffffffffffe80,
                (value_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    local_48 = local_48 + 1;
  }
  PVar6 = compute_median(in_stack_fffffffffffffe90);
  auVar8._8_4_ = extraout_XMM0_Dc;
  auVar8._0_8_ = PVar6.super_array<float,_3UL>._M_elems._0_8_;
  auVar8._12_4_ = extraout_XMM0_Dd;
  fVar7 = PVar6.super_array<float,_3UL>._M_elems[2];
  pvVar5 = Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
           ::back(in_stack_fffffffffffffe70);
  *(long *)(pvVar5->super_array<float,_3UL>)._M_elems = PVar6.super_array<float,_3UL>._M_elems._0_8_
  ;
  (pvVar5->super_array<float,_3UL>)._M_elems[2] = PVar6.super_array<float,_3UL>._M_elems[2];
  local_8c = 0;
  while( true ) {
    iVar1 = local_8c;
    f = diy::ReduceProxy::out_link(in_RSI);
    iVar2 = diy::Link::size((Link *)0x14c89d);
    if (iVar2 <= iVar1) break;
    args = diy::ReduceProxy::out_link(in_RSI);
    BVar4 = diy::Link::target(in_stack_fffffffffffffe68,0);
    local_94 = BVar4.gid;
    iVar3 = diy::Master::Proxy::gid(&in_RSI->super_Proxy);
    if (local_94 == iVar3) {
      in_stack_fffffffffffffe70 = _stderr;
      in_stack_fffffffffffffe7c = diy::Master::Proxy::gid(&in_RSI->super_Proxy);
      fmt::v7::print<char[34],int,unsigned_int&,char>
                ((FILE *)f,(char (*) [34])CONCAT44(iVar1,iVar2),(int *)args,(uint *)BVar4);
    }
    else {
      diy::ReduceProxy::out_link(in_RSI);
      diy::Link::target(in_stack_fffffffffffffe68,0);
      diy::Master::Proxy::enqueue<diy::Point<float,3u>>
                ((Proxy *)in_stack_fffffffffffffe80,
                 (BlockID *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (Point<float,_3U> *)in_stack_fffffffffffffe70,
                 (_func_void_BinaryBuffer_ptr_Point<float,_3U>_ptr *)in_stack_fffffffffffffe68);
      diy::Master::Proxy::gid(&in_RSI->super_Proxy);
      diy::ReduceProxy::out_link(in_RSI);
      in_stack_fffffffffffffe80 = diy::Link::target(in_stack_fffffffffffffe68,0);
      fmt::v7::print<char[29],int,unsigned_int&,int,char>
                (auVar8._0_8_,(char (*) [29])CONCAT44(fVar7,in_stack_fffffffffffffee0),(int *)f,
                 (uint *)CONCAT44(iVar1,iVar2),(int *)args);
    }
    local_8c = local_8c + 1;
  }
  Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::~vector
            ((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)
             in_stack_fffffffffffffe80);
  return;
}

Assistant:

void median_reduce(Block* b,                                  // local block
                   const diy::ReduceProxy& rp,                // communication proxy
                   const diy::RegularMergePartners&)          // partners of the current block
{
    unsigned   round    = rp.round();               // current round number

    std::vector<Block::Point> medians;
    medians.push_back(b->points.back());

    // step 1: dequeue
    for (int i = 0; i < rp.in_link().size(); ++i)
    {
        int nbr_gid = rp.in_link().target(i).gid;
        if (nbr_gid == rp.gid())
        {
            fmt::print(stderr, "[{}:{}] Skipping receiving from self\n", rp.gid(), round);
            continue;
        }

        Block::Point med;
        rp.dequeue(nbr_gid, med);
        fmt::print(stderr, "[{}:{}] Received median values from [{}]\n",
                   rp.gid(), round, nbr_gid);
        medians.push_back(med);
    }

    // step 2 compute median
    Block::Point median = compute_median(medians);
    b->points.back() = median;

    // step 2: enqueue
    for (int i = 0; i < rp.out_link().size(); ++i)    // redundant since size should equal to 1
    {
        // only send to root of group, but not self
        if (rp.out_link().target(i).gid != rp.gid())
        {
            rp.enqueue(rp.out_link().target(i), median);
            fmt::print(stderr, "[{}:{}] Sent median to [{}]\n",
                       rp.gid(), round, rp.out_link().target(i).gid);
        } else {
            fmt::print(stderr, "[{}:{}] Skipping sending to self\n", rp.gid(), round);
        }
    }
}